

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl
          (ParserRefImpl<Catch::clara::detail::Opt> *this,
          shared_ptr<Catch::clara::detail::BoundRef> *ref)

{
  (this->super_ComposableParserImpl<Catch::clara::detail::Opt>).super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__ParserRefImpl_00198bf0;
  this->m_optionality = Optional;
  std::__shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_ref).
              super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>,
             &ref->super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>);
  (this->m_hint)._M_dataplus._M_p = (pointer)&(this->m_hint).field_2;
  (this->m_hint)._M_string_length = 0;
  (this->m_hint).field_2._M_local_buf[0] = '\0';
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  (this->m_description)._M_string_length = 0;
  (this->m_description).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit ParserRefImpl( std::shared_ptr<BoundRef> const &ref ) : m_ref( ref ) {}